

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

bool __thiscall
SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>::EditingIterator::Next
          (EditingIterator *this)

{
  SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount> *this_00;
  code *pcVar1;
  bool bVar2;
  Type pSVar3;
  undefined4 *puVar4;
  EditingIterator *this_local;
  bool local_9;
  
  if (this->last != (NodeBase *)0x0) {
    pSVar3 = SListNodeBase<Memory::JitArenaAllocator>::Next(this->last);
    if (pSVar3 != (this->super_Iterator).current) {
      (this->super_Iterator).current = this->last;
      goto LAB_005f6e6c;
    }
  }
  this->last = (this->super_Iterator).current;
LAB_005f6e6c:
  if ((this->super_Iterator).current == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = (this->super_Iterator).list;
  pSVar3 = SListNodeBase<Memory::JitArenaAllocator>::Next((this->super_Iterator).current);
  local_9 = SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>::IsHead
                      (this_00,pSVar3);
  if (local_9) {
    (this->super_Iterator).current = (NodeBase *)0x0;
  }
  else {
    pSVar3 = SListNodeBase<Memory::JitArenaAllocator>::Next((this->super_Iterator).current);
    (this->super_Iterator).current = pSVar3;
  }
  local_9 = !local_9;
  return local_9;
}

Assistant:

bool Next()
        {
            if (last != nullptr && last->Next() != this->current)
            {
                this->current = last;
            }
            else
            {
                last = this->current;
            }
            return Iterator::Next();
        }